

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O3

char * status_entry(char *key)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *__s;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  char *line;
  size_t line_n;
  char *local_40;
  size_t local_38;
  
  local_40 = (char *)0x0;
  local_38 = 0;
  __stream = fopen("/proc/self/status","r");
  pcVar5 = (char *)0x0;
  if ((__stream != (FILE *)0x0) &&
     (_Var2 = getline(&local_40,&local_38,__stream), pcVar5 = local_40, _Var2 != -1)) {
    do {
      __s = strchr(local_40,0x3a);
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        *__s = '\0';
        iVar1 = strcmp(local_40,key);
        if (iVar1 == 0) goto LAB_001dd594;
      }
      _Var2 = getline(&local_40,&local_38,__stream);
      pcVar5 = local_40;
    } while (_Var2 != -1);
  }
LAB_001dd56a:
  free(pcVar5);
  pcVar6 = (char *)0x0;
LAB_001dd575:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return pcVar6;
LAB_001dd594:
  do {
    do {
      pcVar5 = __s;
      __s = pcVar5 + 1;
      cVar4 = *__s;
    } while (cVar4 == ' ');
  } while (cVar4 == '\t');
  sVar3 = strlen(__s);
  pcVar6 = local_40;
  if (1 < sVar3) {
    pcVar5[sVar3] = '\0';
    cVar4 = *__s;
  }
  pcVar5 = local_40;
  if (cVar4 != '\0') {
    do {
      cVar4 = *__s;
      __s = __s + 1;
      pcVar5 = local_40 + 1;
      *local_40 = cVar4;
      local_40 = pcVar5;
    } while (cVar4 != '\0');
    if (pcVar6 != (char *)0x0) goto LAB_001dd575;
  }
  goto LAB_001dd56a;
}

Assistant:

static char *
status_entry(const char *key)
{
	char *result = NULL;
	char *line = NULL;
	size_t line_n = 0;
	FILE *fp;
	fp = fopen("/proc/self/status", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		char *v;
		v = strchr(line, ':');
		if (!v || *v == '\0')
			continue;
		*v = '\0';
		if (strcmp(line, key) != 0)
			continue;
		++v;
		while (*v == ' ' || *v == '\t')
			++v;
		if (strlen(v) > 1)
			v[strlen(v)-1] = '\0';
		if (*v == '\0')
			goto done;
		result = line;
		while ((*line++ = *v++))
			;
		goto done;
	}
done:
	if (!result)
		free(line);
	if (fp)
		fclose(fp);
	return result;
}